

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

LAYER_CONTEXT * get_layer_context(AV1_COMP *cpi)

{
  return (cpi->svc).layer_context +
         (long)(cpi->svc).temporal_layer_id +
         (long)(cpi->svc).number_temporal_layers * (long)(cpi->svc).spatial_layer_id;
}

Assistant:

static LAYER_CONTEXT *get_layer_context(AV1_COMP *const cpi) {
  return &cpi->svc.layer_context[cpi->svc.spatial_layer_id *
                                     cpi->svc.number_temporal_layers +
                                 cpi->svc.temporal_layer_id];
}